

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter.cpp
# Opt level: O0

QString * createLinkTitle(QString *title)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  LineEndPositions LVar4;
  QChar *end;
  QChar *data;
  QString *result;
  LineEndPositions lineEndPositions;
  QString *this;
  undefined8 in_stack_ffffffffffffffa8;
  QChar c;
  QChar *begin;
  QString *in_stack_ffffffffffffffb0;
  QChar *pQVar5;
  QChar *local_48;
  QChar *local_18;
  
  c.ucs = (char16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QString::QString((QString *)0xa1d782);
  QString::size(in_RSI);
  QString::reserve(in_stack_ffffffffffffffb0,(qsizetype)in_RSI);
  QString::operator+=(this,c);
  local_48 = QString::data(this);
  begin = local_48;
  qVar3 = QString::size(in_RSI);
  pQVar5 = begin + qVar3;
  while (local_48 < pQVar5) {
    LVar4 = findLineEnd(begin,(QChar *)this);
    bVar2 = isBlankLine((QChar *)in_RDI,(QChar *)0xa1d83e);
    local_18 = LVar4.nextLineBegin;
    if (!bVar2) {
      for (; local_48 < local_18; local_48 = local_48 + 1) {
        bVar2 = operator==((QChar *)this,(QChar *)in_RDI);
        if (bVar2) {
          QString::operator+=(this,(QChar)(char16_t)((ulong)begin >> 0x30));
        }
        QString::operator+=(this,(QChar)(char16_t)((ulong)begin >> 0x30));
      }
    }
    local_48 = local_18;
  }
  QString::operator+=(this,(QChar)(char16_t)((ulong)begin >> 0x30));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString createLinkTitle(const QString &title)
{
    QString result;
    result.reserve(title.size() + 2);
    result += qtmw_DoubleQuote;

    const QChar *data = title.data();
    const QChar *end = data + title.size();

    while (data < end) {
        const auto lineEndPositions = findLineEnd(data, end);

        if (!isBlankLine(data, lineEndPositions.lineEnd)) {
            while (data < lineEndPositions.nextLineBegin) {
                if (*data == qtmw_DoubleQuote)
                    result += qtmw_Backslash;
                result += *data;
                ++data;
            }
        }

        data = lineEndPositions.nextLineBegin;
    }

    result += qtmw_DoubleQuote;
    return result;
}